

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

int __thiscall testing::TestCase::reportable_disabled_test_count(TestCase *this)

{
  TestInfo *pTVar1;
  int iVar2;
  pointer ppTVar3;
  uint uVar4;
  long in_FS_OFFSET;
  
  iVar2 = 0;
  for (ppTVar3 = (this->test_info_list_).
                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar3 !=
      (this->test_info_list_).
      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppTVar3 = ppTVar3 + 1) {
    pTVar1 = *ppTVar3;
    uVar4 = 0;
    if ((pTVar1->matches_filter_ == true) && ((pTVar1->is_in_another_shard_ & 1U) == 0)) {
      uVar4 = (uint)pTVar1->is_disabled_;
    }
    iVar2 = iVar2 + uVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int TestCase::reportable_disabled_test_count() const {
  return CountIf(test_info_list_, TestReportableDisabled);
}